

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int pkcs7_verify_unwrap(scep *s,char *cachainfile)

{
  uint uVar1;
  int iVar2;
  BIO_METHOD *pBVar3;
  BIO *pBVar4;
  PKCS7 *pPVar5;
  BIO *b;
  stack_st_PKCS7_SIGNER_INFO *sk_00;
  OPENSSL_STACK *pOVar6;
  PKCS7_SIGNER_INFO *si_00;
  X509 *x509;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *fp_00;
  X509_STORE *cert_store;
  X509_STORE_CTX *cert_ctx;
  FILE *fp;
  X509 *signercert;
  uchar buffer [1024];
  PKCS7_SIGNER_INFO *si;
  stack_st_PKCS7_SIGNER_INFO *sk;
  int used;
  int bytes;
  int len;
  BIO *pkcs7bio;
  BIO *outbio;
  BIO *memorybio;
  char *cachainfile_local;
  scep *s_local;
  
  pBVar3 = BIO_s_mem();
  pBVar4 = BIO_new(pBVar3);
  if (v_flag != 0) {
    printf("%s: reading outer PKCS#7\n",pname);
  }
  uVar1 = BIO_write(pBVar4,s->reply_payload,s->reply_len);
  if ((int)uVar1 < 1) {
    fprintf(_stderr,"%s: error reading PKCS#7 data\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (v_flag != 0) {
    printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar1);
  }
  BIO_set_flags(pBVar4,0x200);
  pPVar5 = (PKCS7 *)d2i_PKCS7_bio(pBVar4,(PKCS7 **)0x0);
  s->reply_p7 = pPVar5;
  if (s->reply_p7 == (PKCS7 *)0x0) {
    fprintf(_stderr,"%s: Error in d2i_PKCS7_bio.\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (d_flag != 0) {
    printf("%s: printing PEM fomatted PKCS#7\n",pname);
    PEM_write_PKCS7(_stdout,(PKCS7 *)s->reply_p7);
  }
  iVar2 = OBJ_obj2nid((ASN1_OBJECT *)s->reply_p7->type);
  if (iVar2 != 0x16) {
    fprintf(_stderr,"%s: PKCS#7 is not signed!\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  pBVar4 = PKCS7_dataInit((PKCS7 *)s->reply_p7,(BIO *)0x0);
  if (pBVar4 == (BIO *)0x0) {
    fprintf(_stderr,"%s: cannot get PKCS#7 data\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  pBVar3 = BIO_s_mem();
  b = BIO_new(pBVar3);
  sk._4_4_ = 0;
  while( true ) {
    iVar2 = BIO_read(pBVar4,&signercert,0x400);
    sk._4_4_ = iVar2 + sk._4_4_;
    if (iVar2 < 1) break;
    BIO_write(b,&signercert,iVar2);
  }
  BIO_ctrl(b,0xb,0,(void *)0x0);
  if (v_flag != 0) {
    printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)sk._4_4_);
  }
  sk_00 = (stack_st_PKCS7_SIGNER_INFO *)PKCS7_get_signer_info((PKCS7 *)s->reply_p7);
  if (sk_00 == (stack_st_PKCS7_SIGNER_INFO *)0x0) {
    fprintf(_stderr,"%s: cannot get signer info!\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (v_flag != 0) {
    printf("%s: verifying signature\n",pname);
  }
  pOVar6 = ossl_check_const_PKCS7_SIGNER_INFO_sk_type(sk_00);
  si_00 = (PKCS7_SIGNER_INFO *)OPENSSL_sk_value(pOVar6,0);
  x509 = PKCS7_cert_from_signer_info((PKCS7 *)s->reply_p7,si_00);
  if (x509 == (X509 *)0x0) {
    printf("%s: Can\'t read signer cert from pkcs7\n",pname);
  }
  iVar2 = PKCS7_signatureVerify(pBVar4,(PKCS7 *)s->reply_p7,si_00,x509);
  if (iVar2 < 1) {
    printf("%s: error verifying signature Error \n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (v_flag != 0) {
    printf("%s: signature ok\n",pname);
  }
  ctx = X509_STORE_new();
  if (ctx == (X509_STORE *)0x0) {
    fprintf(_stderr,"%s: error verifying certificates \n",pname);
  }
  X509_STORE_set_flags(ctx,0);
  X509_STORE_load_locations(ctx,cachainfile,(char *)0x0);
  ctx_00 = X509_STORE_CTX_new();
  if (ctx_00 == (X509_STORE_CTX *)0x0) {
    fprintf(_stderr,"%s: error creating certificate chain \n",pname);
  }
  iVar2 = X509_STORE_CTX_init(ctx_00,ctx,x509,(stack_st_X509 *)0x0);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s: error verifying certificates \n",pname);
  }
  iVar2 = X509_verify_cert(ctx_00);
  if (iVar2 == 0) {
    fprintf(_stderr,"%s: The signer certificate verification failed \n",pname);
  }
  if (w_flag != 0) {
    fp_00 = fopen(w_char,"w");
    if (fp_00 == (FILE *)0x0) {
      fprintf(_stderr,"%s: cannot open cert file for writing\n",w_char);
      exit(0x5d);
    }
    if (v_flag != 0) {
      printf("%s: writing cert\n",w_char);
    }
    if (d_flag != 0) {
      PEM_write_X509(_stdout,x509);
    }
    iVar2 = PEM_write_X509(fp_00,x509);
    if (iVar2 != 1) {
      fprintf(_stderr,"%s: error while writing certificate file\n",w_char);
      ERR_print_errors_fp(_stderr);
      exit(0x5d);
    }
    if (v_flag != 0) {
      printf("%s: certificate written as %s\n",pname,w_char);
    }
    fclose(fp_00);
  }
  pPVar5 = (PKCS7 *)d2i_PKCS7_bio(b,(PKCS7 **)0x0);
  s->reply_p7 = pPVar5;
  if (s->reply_p7 == (PKCS7 *)0x0) {
    fprintf(_stderr,"%s: Error in d2i_PKCS7_bio.\n",pname);
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  X509_STORE_free(ctx);
  X509_STORE_CTX_cleanup(ctx_00);
  return 0;
}

Assistant:

int pkcs7_verify_unwrap(struct scep *s , char * cachainfile ) {
	BIO				*memorybio;
	BIO				*outbio;
	BIO				*pkcs7bio;
	int				len, bytes, used;
	STACK_OF(PKCS7_SIGNER_INFO)	*sk;
	PKCS7_SIGNER_INFO		*si;
	unsigned char			buffer[1024];
    X509   				*signercert;
    FILE 				*fp;

    X509_STORE_CTX 		*cert_ctx;

	X509_STORE *cert_store=NULL;


	/* Create new memory BIO for outer PKCS#7 */
	memorybio = BIO_new(BIO_s_mem());

	/* Read in data */
	if (v_flag)
		printf("%s: reading outer PKCS#7\n",pname);
	if ((len = BIO_write(memorybio, s->reply_payload, s->reply_len)) <= 0) {
		fprintf(stderr, "%s: error reading PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: PKCS#7 payload size: %d bytes\n", pname, len);
	BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
	s->reply_p7 = d2i_PKCS7_bio(memorybio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (d_flag) {
		printf("%s: printing PEM fomatted PKCS#7\n", pname);
		PEM_write_PKCS7(stdout, s->reply_p7);
	}

	 /* Make sure this is a signed PKCS#7 */
        if (!PKCS7_type_is_signed(s->reply_p7)) {
		fprintf(stderr, "%s: PKCS#7 is not signed!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
        }

	/* Create BIO for content data */
	pkcs7bio = PKCS7_dataInit(s->reply_p7, NULL);
	if (pkcs7bio == NULL) {
		fprintf(stderr, "%s: cannot get PKCS#7 data\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy enveloped data from PKCS#7 */
	outbio = BIO_new(BIO_s_mem());
	used = 0;
	for (;;) {
		bytes = BIO_read(pkcs7bio, buffer, sizeof(buffer));
		used += bytes;
		if (bytes <= 0) break;
		BIO_write(outbio, buffer, bytes);
	}
	BIO_flush(outbio);
	if (v_flag)
		printf("%s: PKCS#7 contains %d bytes of signed data\n",
			pname, used);

	/* Get signer */
	sk = PKCS7_get_signer_info(s->reply_p7);
	if (sk == NULL) {
		fprintf(stderr, "%s: cannot get signer info!\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Verify signature */
	if (v_flag)
		printf("%s: verifying signature\n", pname);
	si = sk_PKCS7_SIGNER_INFO_value(sk, 0);

	signercert = PKCS7_cert_from_signer_info(s->reply_p7,si);
	if(signercert == NULL ) printf("%s: Can't read signer cert from pkcs7\n", pname);

//int reson=0;

	if (PKCS7_signatureVerify(pkcs7bio, s->reply_p7, si,signercert ) <= 0) {
		//reson = ERR_GET_REASON(ERR_peek_last_error());
		printf("%s: error verifying signature Error \n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	if (v_flag)
		printf("%s: signature ok\n", pname);

	/*verify certificates*/


	cert_store=X509_STORE_new();
	if(cert_store == NULL)
		fprintf(stderr, "%s: error verifying certificates \n", pname);

	X509_STORE_set_flags(cert_store, 0);

    //X509_STORE_load_locations(cert_store,certsfile,certsdir);
    X509_STORE_load_locations(cert_store,cachainfile,NULL);

    if(!(cert_ctx = X509_STORE_CTX_new())) {;
    fprintf(stderr, "%s: error creating certificate chain \n", pname);
    }

    if(!X509_STORE_CTX_init(cert_ctx,cert_store,signercert,NULL))
    {
    	fprintf(stderr, "%s: error verifying certificates \n", pname);
    }

    //X509_STORE_CTX_set_purpose(cert_ctx, purpose);

    if( !X509_verify_cert(cert_ctx)) {
    	fprintf(stderr, "%s: The signer certificate verification failed \n", pname);
    }

    /*Write pem encoded signer certificate */
	if(w_flag)
	{

#ifdef WIN32
		if ((fopen_s(&fp, w_char, "w")))
#else
		if (!(fp = fopen(w_char, "w")))
#endif
		{
			fprintf(stderr, "%s: cannot open cert file for writing\n",
					w_char);
			exit (SCEP_PKISTATUS_FILE);
		}
		if (v_flag)
			printf("%s: writing cert\n", w_char);
		if (d_flag)
			PEM_write_X509(stdout, signercert);

		if (PEM_write_X509(fp, signercert) != 1) {
			fprintf(stderr, "%s: error while writing certificate "
				"file\n", w_char);
			ERR_print_errors_fp(stderr);
			exit (SCEP_PKISTATUS_FILE);
		}else{
			if(v_flag)
			printf("%s: certificate written as %s\n", pname, w_char);
		}

		(void)fclose(fp);
	}
	/* Copy enveloped data into PKCS#7 */
	s->reply_p7 = d2i_PKCS7_bio(outbio, NULL);
	if (!s->reply_p7) {
		fprintf(stderr, "%s: Error in d2i_PKCS7_bio.\n", pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}

	X509_STORE_free(cert_store);
	X509_STORE_CTX_cleanup(cert_ctx);

	return (0);
}